

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvatiming.c
# Opt level: O3

void time_fuc_engine_watchdog(uint card,char *fuc_engine_name,u32 fucengine)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  void *pvVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  timeval start;
  timeval end;
  timeval local_50;
  timeval local_40;
  
  uVar8 = (ulong)(fucengine + 0x34);
  pvVar4 = nva_cards[(int)card]->bar0;
  uVar1 = *(undefined4 *)((long)pvVar4 + uVar8);
  uVar7 = (ulong)(fucengine + 0x38);
  uVar2 = *(undefined4 *)((long)pvVar4 + uVar7);
  *(undefined4 *)((long)pvVar4 + uVar7) = 1;
  *(undefined4 *)((long)pvVar4 + uVar8) = 0xffffffff;
  uVar5 = 0;
  do {
    uVar6 = uVar5;
    uVar3 = *(uint *)((long)pvVar4 + uVar8);
    if (9999999 < (ulong)uVar3) break;
    uVar5 = uVar6 + 1;
  } while (uVar6 < 9999);
  if ((uVar6 < 9999) && ((uVar3 & 0xffff0000) != 0xbadf0000)) {
    gettimeofday(&local_50,(__timezone_ptr_t)0x0);
    do {
    } while ((ulong)uVar3 - (ulong)*(uint *)((long)nva_cards[(int)card]->bar0 + uVar8) < 10000000);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  }
  printf("%s\'s watchdog: frequency       = %f MHz\n",fuc_engine_name);
  pvVar4 = nva_cards[(int)card]->bar0;
  *(undefined4 *)((long)pvVar4 + uVar7) = uVar2;
  *(undefined4 *)((long)pvVar4 + uVar8) = uVar1;
  return;
}

Assistant:

void time_fuc_engine_watchdog (unsigned int card, const char *fuc_engine_name, u32 fucengine)
{
	struct timeval start, end;
	ptime_t t_start;
	float freq;
	int i = 0;

	/* Save the current values */
	u32 r34 = nva_rd32(card, fucengine + 0x34);
	u32 r38 = nva_rd32(card, fucengine + 0x38);

	nva_wr32(card, fucengine + 0x38, 0x1);
	nva_wr32(card, fucengine + 0x34, 0xffffffff);
	do
	{
		t_start = nva_rd32(card, fucengine + 0x34);
		i++;
	} while (t_start < 10000000 && i < 10000);

	if (i < 10000 && ((t_start & 0xffff0000) != 0xbadf0000)) {
		gettimeofday(&start, NULL);

		while (t_start - nva_rd32(card, fucengine + 0x34) < 10000000);

		gettimeofday(&end, NULL);

		ptime_t val = time_diff_us(start, end);
		freq = 10000000.0 / val;
	} else {
		freq = 0;
	}
	printf("%s's watchdog: frequency       = %f MHz\n", fuc_engine_name, freq);

	/* Restore the previous values */
	nva_wr32(card, fucengine + 0x38, r38);
	nva_wr32(card, fucengine + 0x34, r34);
}